

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

Mio_Cell2_t * Mio_CollectRootsNew2(Mio_Library_t *pLib,int nInputs,int *pnGates,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Mio_Cell2_t *pMVar3;
  undefined8 *__ptr;
  Mio_Gate_t *pMVar4;
  long lVar5;
  ulong uVar6;
  void *__ptr_00;
  Mio_Pin_t *pMVar7;
  word *pwVar8;
  int iVar9;
  Mio_Cell2_t *pMVar10;
  ulong uVar11;
  undefined8 *puVar12;
  char *__s;
  int iVar13;
  int *piVar14;
  int iVar15;
  undefined8 *puVar16;
  uint uVar17;
  byte bVar18;
  double dVar19;
  
  bVar18 = 0;
  iVar2 = Mio_LibraryReadGateNum(pLib);
  pMVar3 = (Mio_Cell2_t *)calloc((long)(iVar2 + 4),0x50);
  __ptr = (undefined8 *)calloc((long)iVar2,0x50);
  pMVar4 = Mio_LibraryReadGates(pLib);
  if (pMVar4 == (Mio_Gate_t *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    do {
      uVar17 = pMVar4->nInputs;
      if (((int)uVar17 <= nInputs) && (pMVar4->pTwin == (Mio_Gate_t *)0x0)) {
        lVar5 = (long)iVar9;
        __ptr[lVar5 * 10] = pMVar4->pName;
        __ptr[lVar5 * 10 + 1] = pMVar4->vExpr;
        *(anon_union_8_2_ab88de1c_for_Mio_GateStruct_t__15 *)(__ptr + lVar5 * 10 + 4) =
             pMVar4->field_15;
        dVar19 = pMVar4->dArea;
        *(float *)((long)__ptr + lVar5 * 0x50 + 0x14) = (float)dVar19;
        dVar19 = dVar19 * 1000.0;
        uVar6 = (ulong)dVar19;
        __ptr[lVar5 * 10 + 3] = (long)(dVar19 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6
        ;
        *(uint *)(__ptr + lVar5 * 10 + 2) =
             *(uint *)(__ptr + lVar5 * 10 + 2) & 0xfffffff | uVar17 << 0x1c;
        __ptr[lVar5 * 10 + 9] = pMVar4;
        *(undefined4 *)(__ptr + lVar5 * 10 + 5) = 0;
        pMVar7 = pMVar4->pPins;
        if (pMVar7 != (Mio_Pin_t *)0x0) {
          piVar14 = (int *)((long)__ptr + lVar5 * 0x50 + 0x2c);
          iVar13 = 0;
          do {
            iVar15 = (int)(pMVar7->dDelayBlockRise * 500.0 + pMVar7->dDelayBlockFall * 500.0);
            *piVar14 = iVar15;
            iVar13 = iVar13 + iVar15;
            pMVar7 = pMVar7->pNext;
            piVar14 = piVar14 + 1;
          } while (pMVar7 != (Mio_Pin_t *)0x0);
          *(int *)(__ptr + lVar5 * 10 + 5) = iVar13;
        }
        iVar9 = iVar9 + 1;
        if ((uVar17 & 0xf) != 0) {
          *(int *)(__ptr + lVar5 * 10 + 5) = *(int *)(__ptr + lVar5 * 10 + 5) / (int)(uVar17 & 0xf);
        }
      }
      pMVar4 = Mio_GateReadNext(pMVar4);
    } while (pMVar4 != (Mio_Gate_t *)0x0);
  }
  if (iVar2 < iVar9) {
    __assert_fail("iCell0 <= nGates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x2b0,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)");
  }
  if (iVar9 < 1) {
    uVar17 = 4;
  }
  else {
    uVar17 = 4;
    puVar16 = __ptr;
    do {
      if (0 < (int)uVar17) {
        uVar6 = (ulong)uVar17;
        pMVar10 = pMVar3;
        do {
          if ((pMVar10->pName != (char *)0x0) && (pMVar10->uTruth == puVar16[4])) {
            uVar6 = puVar16[3];
            uVar11 = pMVar10->AreaW;
            if (uVar11 >= uVar6 && uVar11 != uVar6) goto LAB_003de782;
            if (uVar11 < uVar6) goto LAB_003de790;
            if (*(int *)(puVar16 + 5) < pMVar10->iDelayAve) goto LAB_003de782;
            if (pMVar10->iDelayAve < *(int *)(puVar16 + 5)) goto LAB_003de790;
            iVar13 = strcmp(pMVar10->pName,(char *)*puVar16);
            if (0 < iVar13) goto LAB_003de782;
            if (-1 < iVar13) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                            ,0x28c,"int Mio_CompareTwo2(Mio_Cell2_t *, Mio_Cell2_t *)");
            }
            goto LAB_003de790;
          }
          pMVar10 = pMVar10 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      lVar5 = puVar16[4];
      if (lVar5 + 1U < 2) {
        if (0xfffffff < *(uint *)(puVar16 + 2)) {
          __assert_fail("pCell->nFanins == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x2c3,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)"
                       );
        }
        uVar6 = (ulong)((uint)(lVar5 == -1) * 0x50);
LAB_003de77f:
        pMVar10 = (Mio_Cell2_t *)((long)pMVar3->iDelays + (uVar6 - 0x2c));
      }
      else {
        if ((lVar5 != -0x5555555555555556) && (lVar5 != 0x5555555555555555)) {
          lVar5 = (long)(int)uVar17;
          uVar17 = uVar17 + 1;
          uVar6 = lVar5 * 0x50;
          goto LAB_003de77f;
        }
        if ((*(uint *)(puVar16 + 2) & 0xf0000000) != 0x10000000) {
          __assert_fail("pCell->nFanins == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x2ca,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)"
                       );
        }
        pMVar10 = pMVar3 + 2;
        if (lVar5 == 0x5555555555555555) {
          pMVar10 = pMVar3 + 3;
        }
      }
LAB_003de782:
      puVar12 = puVar16;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        pMVar10->pName = (char *)*puVar12;
        puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
        pMVar10 = (Mio_Cell2_t *)((long)pMVar10 + (ulong)bVar18 * -0x10 + 8);
      }
LAB_003de790:
      puVar16 = puVar16 + 10;
    } while (puVar16 < __ptr + (long)iVar9 * 10);
  }
  if (__ptr != (undefined8 *)0x0) {
    free(__ptr);
  }
  if (pMVar3->pName == (char *)0x0) {
    __s = "Error: Cannot find constant 0 gate in the library.";
  }
  else if (pMVar3[1].pName == (char *)0x0) {
    __s = "Error: Cannot find constant 1 gate in the library.";
  }
  else if (pMVar3[2].pName == (char *)0x0) {
    __s = "Error: Cannot find buffer gate in the library.";
  }
  else {
    if (pMVar3[3].pName != (char *)0x0) {
      uVar6 = (ulong)uVar17;
      if (5 < (int)uVar17) {
        qsort(pMVar3 + 4,(ulong)(uVar17 - 4),0x50,Mio_AreaCompare2);
        iVar9 = Mio_AreaCompare2(pMVar3 + 4,pMVar3 + (uVar6 - 1));
        if (0 < iVar9) {
          __assert_fail("Mio_AreaCompare2( ppCells + 4, ppCells + iCell - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x2de,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)"
                       );
        }
      }
      for (pMVar4 = Mio_LibraryReadGates(pLib); pMVar4 != (Mio_Gate_t *)0x0;
          pMVar4 = Mio_GateReadNext(pMVar4)) {
        Mio_GateSetCell(pMVar4,-1);
      }
      if (0 < (int)uVar17) {
        uVar11 = 0;
        pMVar10 = pMVar3;
        do {
          uVar1 = (uint)uVar11 & 0x3ffffff;
          if (pMVar10->pName == (char *)0x0) {
            uVar1 = 0x3ffffff;
          }
          *(uint *)&pMVar10->field_0x10 = *(uint *)&pMVar10->field_0x10 & 0xfc000000 | uVar1;
          Mio_GateSetCell((Mio_Gate_t *)pMVar10->pMioGate,(uint)uVar11);
          uVar11 = uVar11 + 1;
          pMVar10 = pMVar10 + 1;
        } while (uVar6 != uVar11);
      }
      if (fVerbose != 0) {
        __ptr_00 = calloc((long)(iVar2 + 4),4);
        pMVar4 = Mio_LibraryReadGates(pLib);
        if (pMVar4 != (Mio_Gate_t *)0x0) {
          do {
            if ((pMVar4->nInputs <= nInputs) && (pMVar4->pTwin == (Mio_Gate_t *)0x0)) {
              if ((int)uVar17 < 1) {
LAB_003de9f9:
                __assert_fail("i < iCell",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                              ,0x2f8,
                              "Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)")
                ;
              }
              uVar11 = 0;
              pwVar8 = &pMVar3->uTruth;
              while ((((Mio_Cell2_t *)(pwVar8 + -4))->pName == (char *)0x0 ||
                     (*pwVar8 != (pMVar4->field_15).uTruth))) {
                uVar11 = uVar11 + 1;
                pwVar8 = pwVar8 + 10;
                if (uVar6 == uVar11) goto LAB_003de9f9;
              }
              piVar14 = (int *)((long)__ptr_00 + uVar11 * 4);
              *piVar14 = *piVar14 + 1;
            }
            pMVar4 = Mio_GateReadNext(pMVar4);
          } while (pMVar4 != (Mio_Gate_t *)0x0);
        }
        if (0 < (int)uVar17) {
          uVar11 = 0;
          pMVar10 = pMVar3;
          do {
            printf("%4d : ",uVar11 & 0xffffffff);
            if (pMVar10->pName == (char *)0x0) {
              puts("None");
            }
            else {
              printf("%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n",(double)pMVar10->AreaF,
                     (double)((float)pMVar10->iDelayAve / 1000.0),pMVar10->pName,
                     (ulong)(*(uint *)&pMVar10->field_0x10 >> 0x1c),
                     (ulong)*(uint *)((long)__ptr_00 + uVar11 * 4));
            }
            uVar11 = uVar11 + 1;
            pMVar10 = pMVar10 + 1;
          } while (uVar6 != uVar11);
        }
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
        }
      }
      if (pnGates == (int *)0x0) {
        return pMVar3;
      }
      *pnGates = uVar17;
      return pMVar3;
    }
    __s = "Error: Cannot find inverter gate in the library.";
  }
  puts(__s);
  return (Mio_Cell2_t *)0x0;
}

Assistant:

Mio_Cell2_t * Mio_CollectRootsNew2( Mio_Library_t * pLib, int nInputs, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate0;
    Mio_Cell2_t * ppCells0, * ppCells, * pCell;
    int i, nGates, iCell0 = 0, iCell = 4;
    // create space for new cells
    nGates = Mio_LibraryReadGateNum( pLib );
    ppCells  = ABC_CALLOC( Mio_Cell2_t, nGates + 4 );
    // copy all gates first
    ppCells0 = ABC_CALLOC( Mio_Cell2_t, nGates );
    Mio_LibraryForEachGate( pLib, pGate0 )
        if ( !(pGate0->nInputs > nInputs || pGate0->pTwin) ) // skip large and multi-output
            Mio_CollectCopy2( ppCells0 + iCell0++, pGate0 );
    assert( iCell0 <= nGates );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with smaller average pin delay
    // if these are also equal, select lexicographically smaller name
    for ( pCell = ppCells0; pCell < ppCells0 + iCell0; pCell++ )
    {
        // check if the gate with this functionality already exists
        for ( i = 0; i < iCell; i++ )
            if ( ppCells[i].pName && ppCells[i].uTruth == pCell->uTruth )
            {
                if ( Mio_CompareTwo2( ppCells + i, pCell ) )
                    ppCells[i] = *pCell;
                break;
            }
        if ( i < iCell )
            continue;
        if ( pCell->uTruth == 0 || pCell->uTruth == ~(word)0 )
        {
            int Idx = (int)(pCell->uTruth == ~(word)0);
            assert( pCell->nFanins == 0 );
            ppCells[Idx] = *pCell;
            continue;
        }
        if ( pCell->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) || pCell->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) )
        {
            int Idx = 2 + (int)(pCell->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA));
            assert( pCell->nFanins == 1 );
            ppCells[Idx] = *pCell;
            continue;
        }
        ppCells[iCell++] = *pCell;
    }
    ABC_FREE( ppCells0 );
    if ( ppCells[0].pName == NULL )
        { printf( "Error: Cannot find constant 0 gate in the library.\n" ); return NULL; }
    if ( ppCells[1].pName == NULL )
        { printf( "Error: Cannot find constant 1 gate in the library.\n" ); return NULL; }
    if ( ppCells[2].pName == NULL )
        { printf( "Error: Cannot find buffer gate in the library.\n" );     return NULL; }
    if ( ppCells[3].pName == NULL )
        { printf( "Error: Cannot find inverter gate in the library.\n" );   return NULL; }
    // sort by delay
    if ( iCell > 5 ) 
    {
        qsort( (void *)(ppCells + 4), (size_t)(iCell - 4), sizeof(Mio_Cell2_t), 
                (int (*)(const void *, const void *)) Mio_AreaCompare2 );
        assert( Mio_AreaCompare2( ppCells + 4, ppCells + iCell - 1 ) <= 0 );
    }
    // assign IDs
    Mio_LibraryForEachGate( pLib, pGate0 )
        Mio_GateSetCell( pGate0, -1 );
    for ( i = 0; i < iCell; i++ )
    {
        ppCells[i].Id = ppCells[i].pName ? i : -1;
        Mio_GateSetCell( (Mio_Gate_t *)ppCells[i].pMioGate, i );
    }

    // report
    if ( fVerbose )
    {
        // count gates
        int * pCounts = ABC_CALLOC( int, nGates + 4 );
        Mio_LibraryForEachGate( pLib, pGate0 )
        {
            if ( pGate0->nInputs > nInputs || pGate0->pTwin ) // skip large and multi-output
                continue;
            for ( i = 0; i < iCell; i++ )
                if ( ppCells[i].pName && ppCells[i].uTruth == pGate0->uTruth )
                {
                    pCounts[i]++;
                    break;
                }
            assert( i < iCell );
        }
        for ( i = 0; i < iCell; i++ )
        {
            Mio_Cell2_t * pCell = ppCells + i;
            printf( "%4d : ", i );
            if ( pCell->pName == NULL )
                printf( "None\n" );
            else
                printf( "%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n", 
                    pCell->pName, pCell->nFanins, pCounts[i], pCell->AreaF, Scl_Int2Flt(pCell->iDelayAve) );
        }
        ABC_FREE( pCounts );
    }
    if ( pnGates )
        *pnGates = iCell;
    return ppCells;
}